

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int unixWrite(unqlite_file *id,void *pBuf,unqlite_int64 amt,unqlite_int64 offset)

{
  bool bVar1;
  int local_3c;
  int wrote;
  unixFile *pFile;
  unqlite_int64 offset_local;
  unqlite_int64 amt_local;
  void *pBuf_local;
  unqlite_file *id_local;
  
  local_3c = 0;
  pFile = (unixFile *)offset;
  offset_local = amt;
  amt_local = (unqlite_int64)pBuf;
  while( true ) {
    bVar1 = false;
    if (0 < offset_local) {
      local_3c = seekAndWrite((unixFile *)id,(unqlite_int64)pFile,(void *)amt_local,offset_local);
      bVar1 = 0 < local_3c;
    }
    if (!bVar1) break;
    offset_local = offset_local - local_3c;
    pFile = (unixFile *)((long)&pFile->pMethod + (long)local_3c);
    amt_local = amt_local + local_3c;
  }
  if (offset_local < 1) {
    id_local._4_4_ = 0;
  }
  else if (local_3c < 0) {
    id_local._4_4_ = -2;
  }
  else {
    *(undefined4 *)((long)&id[3].pMethods + 4) = 0;
    id_local._4_4_ = -0x49;
  }
  return id_local._4_4_;
}

Assistant:

static int unixWrite(
  unqlite_file *id, 
  const void *pBuf, 
  unqlite_int64 amt,
  unqlite_int64 offset 
){
  unixFile *pFile = (unixFile*)id;
  int wrote = 0;

  while( amt>0 && (wrote = seekAndWrite(pFile, offset, pBuf, amt))>0 ){
    amt -= wrote;
    offset += wrote;
    pBuf = &((char*)pBuf)[wrote];
  }
  
  if( amt>0 ){
    if( wrote<0 ){
      /* lastErrno set by seekAndWrite */
      return UNQLITE_IOERR;
    }else{
      pFile->lastErrno = 0; /* not a system error */
      return UNQLITE_FULL;
    }
  }
  return UNQLITE_OK;
}